

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int archive_read_format_7zip_bid(archive_read *a,int best_bid)

{
  byte bVar1;
  uint uVar2;
  int *piVar3;
  void *pvVar4;
  ssize_t window;
  ulong uVar5;
  size_t min;
  char *p;
  int iVar6;
  ssize_t bytes_avail;
  long local_40;
  long local_38;
  
  iVar6 = -1;
  if (best_bid < 0x21) {
    iVar6 = 0;
    piVar3 = (int *)__archive_read_ahead(a,6,(ssize_t *)0x0);
    if (piVar3 != (int *)0x0) {
      if ((short)piVar3[1] == 0x1c27 && *piVar3 == -0x504385c9) {
        iVar6 = 0x30;
      }
      else {
        if ((((char)*piVar3 == 'M') && (*(char *)((long)piVar3 + 1) == 'Z')) ||
           (*piVar3 == 0x464c457f)) {
          local_40 = 0x27000;
          uVar5 = 0x1000;
          min = 0x28000;
          do {
            pvVar4 = __archive_read_ahead(a,min,&local_38);
            if (pvVar4 == (void *)0x0) {
              uVar5 = (long)uVar5 >> 1;
              if (uVar5 < 0x40) {
                iVar6 = 0;
              }
              bVar1 = (0x3f < uVar5) + 1;
            }
            else {
              p = (char *)((long)pvVar4 + local_40);
              do {
                if ((char *)(local_38 + (long)pvVar4) <= p + 0x20) {
                  local_40 = (long)p - (long)pvVar4;
                  bVar1 = 0;
                  goto LAB_00177bad;
                }
                uVar2 = check_7zip_header_in_sfx(p);
                p = p + uVar2;
              } while (uVar2 != 0);
              iVar6 = 0x30;
              bVar1 = 1;
            }
LAB_00177bad:
            if ((bVar1 & 1) != 0) goto LAB_00177bc9;
            min = local_40 + uVar5;
          } while ((long)min < 0x60001);
          bVar1 = 0;
LAB_00177bc9:
          if (bVar1 != 0) {
            return iVar6;
          }
        }
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

static int
archive_read_format_7zip_bid(struct archive_read *a, int best_bid)
{
	const char *p;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	if ((p = __archive_read_ahead(a, 6, NULL)) == NULL)
		return (0);

	/* If first six bytes are the 7-Zip signature,
	 * return the bid right now. */
	if (memcmp(p, _7ZIP_SIGNATURE, 6) == 0)
		return (48);

	/*
	 * It may a 7-Zip SFX archive file. If first two bytes are
	 * 'M' and 'Z' available on Windows or first four bytes are
	 * "\x7F\x45LF" available on posix like system, seek the 7-Zip
	 * signature. Although we will perform a seek when reading
	 * a header, what we do not use __archive_read_seek() here is
	 * due to a bidding performance.
	 */
	if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
		ssize_t offset = SFX_MIN_ADDR;
		ssize_t window = 4096;
		ssize_t bytes_avail;
		while (offset + window <= (SFX_MAX_ADDR)) {
			const char *buff = __archive_read_ahead(a,
					offset + window, &bytes_avail);
			if (buff == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 0x40)
					return (0);
				continue;
			}
			p = buff + offset;
			while (p + 32 < buff + bytes_avail) {
				int step = check_7zip_header_in_sfx(p);
				if (step == 0)
					return (48);
				p += step;
			}
			offset = p - buff;
		}
	}
	return (0);
}